

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

void SimplifySegments(VP8Encoder *enc)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long in_RDI;
  int i;
  VP8SegmentInfo *S2;
  int found;
  VP8SegmentInfo *S1;
  int s2;
  int s1;
  int num_final_segments;
  int num_segments;
  int map [4];
  int local_48;
  int local_44;
  int local_28;
  int local_24;
  int local_20;
  int local_18 [4];
  long local_8;
  
  local_18[0] = 0;
  local_18[1] = 1;
  local_18[2] = 2;
  local_18[3] = 3;
  if (*(int *)(in_RDI + 0x20) < 4) {
    local_48 = *(int *)(in_RDI + 0x20);
  }
  else {
    local_48 = 4;
  }
  local_20 = 1;
  local_24 = 1;
  local_8 = in_RDI;
  do {
    if (local_48 <= local_24) {
      if (local_20 < local_48) {
        local_44 = *(int *)(local_8 + 0x30) * *(int *)(local_8 + 0x34);
        while (iVar2 = local_44 + -1, 0 < local_44) {
          *(byte *)(*(long *)(local_8 + 0x5c60) + (long)iVar2 * 4) =
               *(byte *)(*(long *)(local_8 + 0x5c60) + (long)iVar2 * 4) & 0x9f |
               ((byte)local_18[*(byte *)(*(long *)(local_8 + 0x5c60) + (long)iVar2 * 4) >> 5 & 3] &
               3) << 5;
          local_44 = iVar2;
        }
        *(int *)(local_8 + 0x20) = local_20;
        for (local_44 = local_20; local_44 < local_48; local_44 = local_44 + 1) {
          memcpy((void *)(local_8 + 0x260 + (long)local_44 * 0x2e8),
                 (void *)(local_8 + 0x260 + (long)(local_20 + -1) * 0x2e8),0x2e8);
        }
      }
      return;
    }
    lVar3 = local_8 + 0x260;
    bVar1 = false;
    for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
      iVar2 = SegmentsAreEquivalent
                        ((VP8SegmentInfo *)(lVar3 + (long)local_24 * 0x2e8),
                         (VP8SegmentInfo *)(local_8 + 0x260 + (long)local_28 * 0x2e8));
      if (iVar2 != 0) {
        bVar1 = true;
        break;
      }
    }
    local_18[local_24] = local_28;
    if (!bVar1) {
      if (local_20 != local_24) {
        memcpy((void *)(local_8 + 0x260 + (long)local_20 * 0x2e8),
               (void *)(local_8 + 0x260 + (long)local_24 * 0x2e8),0x2e8);
      }
      local_20 = local_20 + 1;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

static void SimplifySegments(VP8Encoder* const enc) {
  int map[NUM_MB_SEGMENTS] = { 0, 1, 2, 3 };
  // 'num_segments_' is previously validated and <= NUM_MB_SEGMENTS, but an
  // explicit check is needed to avoid a spurious warning about 'i' exceeding
  // array bounds of 'dqm_' with some compilers (noticed with gcc-4.9).
  const int num_segments = (enc->segment_hdr_.num_segments_ < NUM_MB_SEGMENTS)
                               ? enc->segment_hdr_.num_segments_
                               : NUM_MB_SEGMENTS;
  int num_final_segments = 1;
  int s1, s2;
  for (s1 = 1; s1 < num_segments; ++s1) {    // find similar segments
    const VP8SegmentInfo* const S1 = &enc->dqm_[s1];
    int found = 0;
    // check if we already have similar segment
    for (s2 = 0; s2 < num_final_segments; ++s2) {
      const VP8SegmentInfo* const S2 = &enc->dqm_[s2];
      if (SegmentsAreEquivalent(S1, S2)) {
        found = 1;
        break;
      }
    }
    map[s1] = s2;
    if (!found) {
      if (num_final_segments != s1) {
        enc->dqm_[num_final_segments] = enc->dqm_[s1];
      }
      ++num_final_segments;
    }
  }
  if (num_final_segments < num_segments) {  // Remap
    int i = enc->mb_w_ * enc->mb_h_;
    while (i-- > 0) enc->mb_info_[i].segment_ = map[enc->mb_info_[i].segment_];
    enc->segment_hdr_.num_segments_ = num_final_segments;
    // Replicate the trailing segment infos (it's mostly cosmetics)
    for (i = num_final_segments; i < num_segments; ++i) {
      enc->dqm_[i] = enc->dqm_[num_final_segments - 1];
    }
  }
}